

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O3

void __thiscall
StringType::GenCheckingCStr(StringType *this,Output *out_cc,Env *env,DataPtr *data,string *str_size)

{
  pointer pcVar1;
  string str_val;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  Type::GenBoundaryCheck(&this->super_Type,out_cc,env,data);
  local_70 = local_60;
  pcVar1 = (this->str_->str_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (this->str_->str_)._M_string_length);
  Output::println(out_cc,"if ( memcmp(%s, %s, %s) != 0 )",(data->ptr_expr_)._M_dataplus._M_p,
                  local_70,(str_size->_M_dataplus)._M_p);
  out_cc->indent_ = out_cc->indent_ + 1;
  Output::println(out_cc,"{");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_70,local_68 + (long)local_70);
  GenStringMismatch(this,out_cc,env,data,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  Output::println(out_cc,"}");
  out_cc->indent_ = out_cc->indent_ + -1;
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return;
}

Assistant:

void StringType::GenCheckingCStr(Output* out_cc, Env* env, const DataPtr& data,
                                 const string& str_size)
	{
	// TODO: extend it for dynamic strings
	ASSERT(type_ == CSTR);

	GenBoundaryCheck(out_cc, env, data);

	string str_val = str_->str();

	// Compare the string and report error on mismatch
	out_cc->println("if ( memcmp(%s, %s, %s) != 0 )", data.ptr_expr(), str_val.c_str(),
	                str_size.c_str());
	out_cc->inc_indent();
	out_cc->println("{");
	GenStringMismatch(out_cc, env, data, str_val);
	out_cc->println("}");
	out_cc->dec_indent();
	}